

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

int Bits::CountLeadingZeros32_Portable(uint32 n)

{
  undefined4 local_14;
  undefined4 local_10;
  int bits;
  uint32 n_local;
  
  local_14 = 1;
  if (n == 0) {
    bits = 0x20;
  }
  else {
    local_10 = n;
    if (n >> 0x10 == 0) {
      local_14 = 0x11;
      local_10 = n << 0x10;
    }
    if (local_10 >> 0x18 == 0) {
      local_14 = local_14 + 8;
      local_10 = local_10 << 8;
    }
    if (local_10 >> 0x1c == 0) {
      local_14 = local_14 + 4;
      local_10 = local_10 << 4;
    }
    if (local_10 >> 0x1e == 0) {
      local_14 = local_14 + 2;
      local_10 = local_10 << 2;
    }
    bits = local_14 + ((int)local_10 >> 0x1f);
  }
  return bits;
}

Assistant:

int Bits::CountLeadingZeros32_Portable(uint32 n) {
  int bits = 1;
  if (n == 0)
    return 32;
  if ((n >> 16) == 0) {
    bits += 16;
    n <<= 16;
  }
  if ((n >> 24) == 0) {
    bits += 8;
    n <<= 8;
  }
  if ((n >> 28) == 0) {
    bits += 4;
    n <<= 4;
  }
  if ((n >> 30) == 0) {
    bits += 2;
    n <<= 2;
  }
  return bits - (n >> 31);
}